

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

Expression __thiscall
dynet::expr::detail::
f<dynet::Sum,std::vector<dynet::expr::Expression,std::allocator<dynet::expr::Expression>>>
          (detail *this,
          vector<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_> *xs)

{
  vector<dynet::Node*,std::allocator<dynet::Node*>> *this_00;
  pointer pEVar1;
  iterator __position;
  pointer pEVar2;
  Node *pNVar3;
  VariableIndex *pVVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  Expression EVar6;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> xis;
  allocator_type local_3d;
  undefined4 local_3c;
  Node *local_38;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> local_30;
  
  pEVar2 = (xs->
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = (vector<dynet::Node*,std::allocator<dynet::Node*>> *)pEVar2->pg;
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::vector
            (&local_30,
             (long)(xs->
                   super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 4,
             (allocator_type *)&local_38);
  pEVar1 = (xs->
           super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar4 = local_30.super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (pEVar2 = (xs->
                super__Vector_base<dynet::expr::Expression,_std::allocator<dynet::expr::Expression>_>
                )._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    pVVar4->t = (pEVar2->i).t;
    pVVar4 = pVVar4 + 1;
  }
  local_3c = (undefined4)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 3);
  pNVar3 = (Node *)operator_new(0x58);
  *(code **)pNVar3 = dynet::ComputationGraph::forward;
  std::vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>>::
  vector<__gnu_cxx::__normal_iterator<dynet::VariableIndex_const*,std::vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>>>,void>
            ((vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>> *)(pNVar3 + 8),
             (__normal_iterator<const_dynet::VariableIndex_*,_std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>_>
              )local_30.
               super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_dynet::VariableIndex_*,_std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>_>
              )local_30.
               super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_3d);
  *(undefined8 *)(pNVar3 + 0x3c) = 0x100000000;
  *(undefined8 *)(pNVar3 + 0x48) = default_device;
  *(undefined **)pNVar3 = &Concatenate::vtable;
  __position._M_current = *(Node ***)(this_00 + 8);
  local_38 = pNVar3;
  if (__position._M_current == *(Node ***)(this_00 + 0x10)) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              (this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar3;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  dynet::ComputationGraph::set_dim_for_new_node((VariableIndex *)this_00);
  *(vector<dynet::Node*,std::allocator<dynet::Node*>> **)this = this_00;
  *(undefined4 *)(this + 8) = local_3c;
  uVar5 = extraout_RDX;
  if (local_30.super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
      _M_impl.super__Vector_impl_data._M_start != (VariableIndex *)0x0) {
    operator_delete(local_30.
                    super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar5 = extraout_RDX_00;
  }
  EVar6._8_8_ = uVar5;
  EVar6.pg = (ComputationGraph *)this;
  return EVar6;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }